

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2LFO::tick(V2LFO *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  
  uVar1 = this->cntr;
  uVar2 = this->mode & 7;
  uVar3 = uVar1;
  if (uVar2 - 1 < 4) {
    switch(uVar2) {
    case 1:
      uVar3 = (int)uVar1 >> 0x1f ^ uVar1 * 2;
      break;
    case 2:
      uVar3 = (int)uVar1 >> 0x1f;
      break;
    case 3:
      fVar4 = fastsinrc(((float)(uVar1 >> 9 | 0x3f800000) + -1.0) * 6.2831855);
      fVar4 = fVar4 * 0.5 + 0.5;
      uVar1 = this->cntr;
      goto LAB_0010a6cf;
    case 4:
      uVar3 = this->nseed;
      if (uVar1 < this->last) {
        uVar3 = uVar3 * 0xbb38435 + 0x3619636b;
        this->nseed = uVar3;
      }
      this->last = uVar1;
    }
  }
  fVar4 = (float)(uVar3 >> 9 | 0x3f800000) + -1.0;
LAB_0010a6cf:
  this->out = fVar4 * this->gain + this->dc;
  this->cntr = uVar1 + this->freq;
  if ((CARRY4(uVar1,this->freq)) && (this->eg == true)) {
    this->cntr = 0xffffffff;
  }
  return;
}

Assistant:

void tick()
    {
        float v;
        uint32_t x;

        switch (mode & 7)
        {
        case SAW:
        default:
            COVER("LFO saw");
            v = utof23(cntr);
            break;

        case TRI:
            COVER("LFO tri");
            x = (cntr << 1) ^ (int32_t(cntr) >> 31);
            v = utof23(x);
            break;

        case PULSE:
            COVER("LFO pulse");
            x = int32_t(cntr) >> 31;
            v = utof23(x);
            break;

        case SIN:
            COVER("LFO sin");
            v = utof23(cntr);
            v = fastsinrc(v * fc2pi) * 0.5f + 0.5f;
            break;

        case S_H:
            COVER("LFO sample+hold");
            if (cntr < last)
                nseed = urandom(&nseed);
            last = cntr;
            v = utof23(nseed);
            break;
        }

        out = v * gain + dc;
        cntr += freq;
        if (cntr < (uint32_t)freq && eg) // in one-shot mode, clamp at wrap-around
            cntr = ~0u;

        DEBUG_PLOT_VAL(this, out / 128.0f);
    }